

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_write1(BGZF *fp,bam1_t *b)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  ssize_t sVar5;
  long lVar6;
  byte bVar7;
  bool bVar8;
  uint32_t block_len;
  uint32_t y;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  uVar1 = b->l_data + 0x20;
  local_48._0_4_ = (b->core).tid;
  local_48._4_4_ = (b->core).pos;
  uVar3 = *(undefined8 *)&(b->core).field_0x8;
  local_40 = (uint)((ulong)uVar3 >> 0x18) & 0xff |
             (uint)((ulong)uVar3 >> 8) & 0xff00 | (int)uVar3 << 0x10;
  local_3c = (uint)(ushort)((ulong)uVar3 >> 0x30) | (uint)((ulong)uVar3 >> 0x10) & 0xffff0000;
  local_38._0_4_ = (b->core).l_qseq;
  local_38._4_4_ = (b->core).mtid;
  uStack_30._0_4_ = (b->core).mpos;
  uStack_30._4_4_ = (b->core).isize;
  block_len = uVar1;
  iVar4 = bgzf_flush_try(fp,(ulong)(b->l_data + 0x24));
  if ((fp->field_0x2 & 0xc) == 0) {
    if (iVar4 < 0) {
      bVar7 = 1;
      goto LAB_001307ca;
    }
    sVar5 = bgzf_write(fp,&block_len,4);
    bVar8 = -1 < sVar5;
  }
  else {
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      uVar2 = *(uint *)((long)&local_48 + lVar6 * 4);
      *(uint *)((long)&local_48 + lVar6 * 4) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    if (iVar4 < 0) {
      bVar8 = false;
      y = uVar1;
    }
    else {
      y = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 * 0x1000000;
      sVar5 = bgzf_write(fp,&y,4);
      bVar8 = -1 < sVar5;
    }
    swap_data(&b->core,b->l_data,b->data,1);
  }
  bVar7 = 1;
  if (bVar8) {
    sVar5 = bgzf_write(fp,&local_48,0x20);
    if (-1 < sVar5) {
      sVar5 = bgzf_write(fp,b->data,(long)b->l_data);
      bVar7 = (byte)((ulong)sVar5 >> 0x3f);
    }
  }
LAB_001307ca:
  if ((fp->field_0x2 & 0xc) != 0) {
    swap_data(&b->core,b->l_data,b->data,0);
  }
  iVar4 = -1;
  if (bVar7 == 0) {
    iVar4 = block_len + 4;
  }
  return iVar4;
}

Assistant:

int bam_write1(BGZF *fp, const bam1_t *b)
{
    const bam1_core_t *c = &b->core;
    uint32_t x[8], block_len = b->l_data + 32, y;
    int i, ok;
    x[0] = c->tid;
    x[1] = c->pos;
    x[2] = (uint32_t)c->bin<<16 | c->qual<<8 | c->l_qname;
    x[3] = (uint32_t)c->flag<<16 | c->n_cigar;
    x[4] = c->l_qseq;
    x[5] = c->mtid;
    x[6] = c->mpos;
    x[7] = c->isize;
    ok = (bgzf_flush_try(fp, 4 + block_len) >= 0);
    if (fp->is_be) {
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
        y = block_len;
        if (ok) ok = (bgzf_write(fp, ed_swap_4p(&y), 4) >= 0);
        swap_data(c, b->l_data, b->data, 1);
    } else {
        if (ok) ok = (bgzf_write(fp, &block_len, 4) >= 0);
    }
    if (ok) ok = (bgzf_write(fp, x, 32) >= 0);
    if (ok) ok = (bgzf_write(fp, b->data, b->l_data) >= 0);
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return ok? 4 + block_len : -1;
}